

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O3

Result __thiscall
Kernel::LiteralOrdering<Kernel::LAKBO>::compare
          (LiteralOrdering<Kernel::LAKBO> *this,Literal *l1,Literal *l2)

{
  Result RVar1;
  Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  atoms2;
  Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  atoms1;
  undefined1 in_stack_000001d0 [24];
  undefined1 in_stack_000001e8 [24];
  Literal *local_c0;
  Literal *local_b8;
  LiteralOrdering<Kernel::LAKBO> *local_b0;
  Literal **ppLStack_a8;
  Literal **local_a0;
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  *local_98;
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  *pOStack_90;
  LiteralOrdering<Kernel::LAKBO> *local_88;
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  local_80;
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  local_58;
  
  local_c0 = l2;
  local_b8 = l1;
  atoms((Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
         *)&local_58,this,l1);
  atoms((Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
         *)&local_80,this,l2);
  if (local_58._isSome == false) {
    RVar1 = GREATER;
    if (local_80._isSome == false) {
      RVar1 = compareUninterpreted(this,l1,l2);
    }
  }
  else {
    RVar1 = LESS;
    if (local_80._isSome != false) {
      ppLStack_a8 = &local_b8;
      local_a0 = &local_c0;
      local_b0 = this;
      local_98 = &local_58;
      pOStack_90 = &local_80;
      local_88 = this;
      RVar1 = AlascaOrderingUtils::
              lexLazy<Kernel::LiteralOrdering<Kernel::LAKBO>::compare(Kernel::Literal*,Kernel::Literal*)const::_lambda()_1_,Kernel::LiteralOrdering<Kernel::LAKBO>::compare(Kernel::Literal*,Kernel::Literal*)const::_lambda()_2_>
                        ((_ElementType)in_stack_000001d0,(_ElementType)in_stack_000001e8);
    }
  }
  Lib::
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  ::~OptionBase(&local_80);
  Lib::
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  ::~OptionBase(&local_58);
  return RVar1;
}

Assistant:

Result compare(Literal* l1, Literal* l2) const override {
    auto atoms1 = atoms(l1);
    auto atoms2 = atoms(l2);
    if (!atoms1.isSome() && atoms2.isSome()) {
      return Ordering::GREATER;

    } else if (atoms1.isSome() && !atoms2.isSome()) {
      return Ordering::LESS;

    } else if (atoms1.isSome() && atoms2.isSome()) {
      return AlascaOrderingUtils::lexLazy(
            [&](){ return OrderingUtils::mulExt(*atoms1, *atoms2, [&](auto l, auto r) { return cmpAtom(l, r); }); },
            [&](){ return cmpPrec(l1, l2); }
            );

    } else {
      ASS(atoms1.isNone() && atoms2.isNone())
      return compareUninterpreted(l1,l2);
    }
  }